

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::initialiseInstance(HEkkPrimal *this)

{
  reference pvVar1;
  long *in_RDI;
  HighsInt unaff_retaddr;
  HighsInt unaff_retaddr_00;
  HSet *in_stack_00000008;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *in_stack_00000010;
  bool debug;
  HighsInt iCol;
  undefined2 uVar2;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffff4;
  int iVar4;
  long *__new_size;
  
  in_RDI[1] = *in_RDI + 0x18;
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(*in_RDI + 0x2198);
  *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)(*in_RDI + 0x219c);
  *(int *)(in_RDI + 3) = (int)in_RDI[2] + *(int *)((long)in_RDI + 0x14);
  __new_size = in_RDI;
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_RDI >> 0x20));
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (in_stack_00000010,(size_type)in_stack_00000008);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (in_stack_00000010,(size_type)in_stack_00000008);
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  for (iVar4 = 0; iVar4 < (int)in_RDI[3]; iVar4 = iVar4 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25a8),(long)iVar4);
    if ((*pvVar1 == -INFINITY) && (!NAN(*pvVar1))) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25c0),(long)iVar4)
      ;
      if ((*pvVar1 == INFINITY) && (!NAN(*pvVar1))) {
        *(int *)(in_RDI + 0x1f) = (int)in_RDI[0x1f] + 1;
      }
    }
  }
  uVar3 = CONCAT13(1 < *(int *)(*(long *)(*in_RDI + 8) + 0x15c),(int3)in_stack_fffffffffffffff0);
  if ((int)in_RDI[0x1f] != 0) {
    highsLogDev((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kInfo,
                "HEkkPrimal:: LP has %d free columns\n",(ulong)*(uint *)(in_RDI + 0x1f));
    HSet::setup(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,SUB81((ulong)__new_size >> 0x38,0),
                (FILE *)CONCAT44(iVar4,uVar3),SUB81((ulong)in_RDI >> 0x38,0),
                SUB81((ulong)in_RDI >> 0x30,0));
  }
  uVar2 = (undefined2)((ulong)in_RDI >> 0x30);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (size_type)__new_size);
  HSet::setup(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,SUB81((ulong)__new_size >> 0x38,0),
              (FILE *)CONCAT44(iVar4,uVar3),SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0));
  return;
}

Assistant:

void HEkkPrimal::initialiseInstance() {
  // Called in constructor for HEkkPrimal class
  analysis = &ekk_instance_.analysis_;

  num_col = ekk_instance_.lp_.num_col_;
  num_row = ekk_instance_.lp_.num_row_;
  num_tot = num_col + num_row;

  // Setup local vectors
  col_aq.setup(num_row);
  row_ep.setup(num_row);
  row_ap.setup(num_col);
  col_basic_feasibility_change.setup(num_row);
  row_basic_feasibility_change.setup(num_col);
  col_steepest_edge.setup(num_row);

  ph1SorterR.reserve(num_row);
  ph1SorterT.reserve(num_row);

  num_free_col = 0;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (ekk_instance_.info_.workLower_[iCol] == -kHighsInf &&
        ekk_instance_.info_.workUpper_[iCol] == kHighsInf) {
      // Free column
      num_free_col++;
    }
  }
  // Set up the HSet instances, possibly using the internal error reporting and
  // debug option
  const bool debug =
      ekk_instance_.options_->highs_debug_level > kHighsDebugLevelCheap;
  if (num_free_col) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkPrimal:: LP has %" HIGHSINT_FORMAT " free columns\n",
                num_free_col);
    nonbasic_free_col_set.setup(
        num_free_col, num_tot, ekk_instance_.options_->output_flag,
        ekk_instance_.options_->log_options.log_stream, debug);
  }
  // Set up the hyper-sparse CHUZC data
  hyper_chuzc_candidate.resize(1 + max_num_hyper_chuzc_candidates);
  hyper_chuzc_measure.resize(1 + max_num_hyper_chuzc_candidates);
  hyper_chuzc_candidate_set.setup(
      max_num_hyper_chuzc_candidates, num_tot,
      ekk_instance_.options_->output_flag,
      ekk_instance_.options_->log_options.log_stream, debug);
}